

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  Char CVar1;
  Char c;
  Reader *this_local;
  
  while( true ) {
    if (this->current_ == this->end_) {
      return true;
    }
    CVar1 = getNextChar(this);
    if (CVar1 == '\r') break;
    if (CVar1 == '\n') {
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\r' || c == '\n')
      break;
  }
  return true;
}